

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

double __thiscall
imrt::EvaluationFunction::get_delta_eval
          (EvaluationFunction *this,int angle,int b,double delta_intensity,
          vector<double,_std::allocator<double>_> *w,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,int n_voxels)

{
  double dVar1;
  double dVar2;
  int iVar3;
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  *__x;
  Matrix *pMVar4;
  _Base_ptr p_Var5;
  long lVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  double local_90;
  key_type local_68;
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  local_60;
  
  local_68.second = b;
  local_68.first = angle;
  __x = &std::__detail::
         _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::at((_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&this->beamlet2voxel_list,&local_68)->_M_t;
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::_Rb_tree(&local_60,__x);
  iVar7 = 0;
  local_90 = 0.0;
  for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    iVar3 = *(int *)&p_Var5[1]._M_parent;
    lVar6 = (long)*(int *)((long)&p_Var5[1]._M_parent + 4);
    pMVar4 = Volume::getDepositionMatrix
                       ((this->volumes->
                        super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
                        super__Vector_impl_data._M_start + iVar3,angle);
    dVar8 = pMVar4->p[lVar6][b] * delta_intensity;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar9 = *(double *)
               (*(long *)&(this->Z).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar3].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + lVar6 * 8);
      dVar1 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      dVar11 = dVar8 + dVar9;
      if (dVar1 <= dVar9) {
        dVar10 = 0.0;
        if (dVar11 < dVar1) {
          dVar10 = (dVar1 - dVar11) * (dVar1 - dVar11) *
                   (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar3] + 0.0;
        }
      }
      else {
        dVar10 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        if (dVar1 <= dVar11) {
          dVar10 = 0.0 - dVar10 * (dVar1 - dVar9) * (dVar1 - dVar9);
        }
        else {
          dVar10 = ((dVar9 - dVar1) + (dVar9 - dVar1) + dVar8) * dVar10 * dVar8 + 0.0;
        }
      }
      dVar1 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      if (dVar9 <= dVar1) {
        if (dVar1 < dVar11) {
          dVar10 = dVar10 + (dVar11 - dVar1) * (dVar11 - dVar1) *
                            (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[iVar3];
        }
      }
      else {
        dVar2 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar3];
        dVar9 = dVar9 - dVar1;
        if (dVar11 <= dVar1) {
          dVar10 = dVar10 - dVar2 * dVar9 * dVar9;
        }
        else {
          dVar10 = dVar10 + (dVar9 + dVar9 + dVar8) * dVar2 * dVar8;
        }
      }
      local_90 = local_90 +
                 dVar10 / (double)(this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar3];
      if (n_voxels <= iVar7) break;
      iVar7 = iVar7 + 1;
    }
  }
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree(&local_60);
  return local_90;
}

Assistant:

double EvaluationFunction::get_delta_eval(int angle, int b, double delta_intensity,
	vector<double>& w, vector<double>& Zmin, vector<double>& Zmax,int n_voxels) const{

	 multimap<double, pair<int,int> > voxels =
	                                   beamlet2voxel_list.at(make_pair(angle,b));
	 double delta_F=0.0;

	 int i=0;
	 for(auto voxel:voxels){
		 int o=voxel.second.first, k=voxel.second.second;
		 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		 double delta = Dep(k,b)*(delta_intensity);
		 if(delta==0.0) continue;

		 double pen=0.0;
 		 //with the change in the dose of a voxel we can incrementally modify the value of F
 		 if(Z[o][k] < Zmin[o] && Z[o][k] + delta < Zmin[o]) //update the penalty
 			pen += w[o]*delta*(delta+2*(Z[o][k]-Zmin[o]));
 		 else if(Z[o][k] < Zmin[o]) //the penalty disappears
 			pen -=  w[o] * ( pow(Zmin[o]-Z[o][k], 2) );
 		 else if(Z[o][k] + delta < Zmin[o]) //the penalty appears
 			pen +=  w[o] * ( pow(Zmin[o]-(Z[o][k]+delta), 2) );

 		 if(Z[o][k] > Zmax[o] && Z[o][k] + delta > Zmax[o]) //update the penalty
 			 pen += w[o]*delta*(delta+2*(-Zmax[o] + Z[o][k]));
 		 else if(Z[o][k] > Zmax[o]) //the penalty disappears
 			 pen -=  w[o] * ( pow(Z[o][k]-Zmax[o], 2) );
 		 else if(Z[o][k] + delta > Zmax[o]) //the penalty appears
 			 pen +=  w[o] * ( pow(Z[o][k]+delta - Zmax[o], 2) );

 		 delta_F += pen/nb_voxels[o];
		 i++; if(i>n_voxels) break;
	 }
	 return delta_F;
}